

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

bool vkt::memory::anon_unknown_0::layoutSupportedByUsage(Usage usage,VkImageLayout layout)

{
  Usage UVar1;
  VkImageLayout layout_local;
  Usage usage_local;
  
  switch(layout) {
  case VK_IMAGE_LAYOUT_GENERAL:
    layout_local._3_1_ = 1;
    break;
  case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
    UVar1 = operator&(usage,USAGE_COLOR_ATTACHMENT);
    layout_local._3_1_ = UVar1 != 0;
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
    UVar1 = operator&(usage,USAGE_DEPTH_STENCIL_ATTACHMENT);
    layout_local._3_1_ = UVar1 != 0;
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:
    UVar1 = operator&(usage,USAGE_DEPTH_STENCIL_ATTACHMENT);
    layout_local._3_1_ = UVar1 != 0;
    break;
  case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
    UVar1 = operator&(usage,USAGE_SAMPLED_IMAGE);
    layout_local._3_1_ = UVar1 != 0;
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
    UVar1 = operator&(usage,USAGE_TRANSFER_SRC);
    layout_local._3_1_ = UVar1 != 0;
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
    UVar1 = operator&(usage,USAGE_TRANSFER_DST);
    layout_local._3_1_ = UVar1 != 0;
    break;
  case VK_IMAGE_LAYOUT_PREINITIALIZED:
    layout_local._3_1_ = 1;
    break;
  default:
    layout_local._3_1_ = VK_IMAGE_LAYOUT_UNDEFINED >> 0x18;
  }
  return (bool)layout_local._3_1_;
}

Assistant:

bool layoutSupportedByUsage (Usage usage, vk::VkImageLayout layout)
{
	switch (layout)
	{
		case vk::VK_IMAGE_LAYOUT_GENERAL:
			return true;

		case vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
			return (usage & USAGE_COLOR_ATTACHMENT) != 0;

		case vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
			return (usage & USAGE_DEPTH_STENCIL_ATTACHMENT) != 0;

		case vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:
			return (usage & USAGE_DEPTH_STENCIL_ATTACHMENT) != 0;

		case vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
			// \todo [2016-03-09 mika] Should include input attachment
			return (usage & USAGE_SAMPLED_IMAGE) != 0;

		case vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
			return (usage & USAGE_TRANSFER_SRC) != 0;

		case vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
			return (usage & USAGE_TRANSFER_DST) != 0;

		case vk::VK_IMAGE_LAYOUT_PREINITIALIZED:
			return true;

		default:
			DE_FATAL("Unknown layout");
			return false;
	}
}